

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O1

TIFFReadDirEntryErr TIFFReadDirEntryCheckedLong8(TIFF *tif,TIFFDirEntry *direntry,uint64_t *value)

{
  TIFFReadDirEntryErr TVar1;
  uint32_t offset;
  uint32_t local_1c;
  
  if ((tif->tif_flags >> 0x13 & 1) == 0) {
    local_1c = (direntry->tdir_offset).toff_long;
    if ((char)tif->tif_flags < '\0') {
      TIFFSwabLong(&local_1c);
    }
    TVar1 = TIFFReadDirEntryData(tif,(ulong)local_1c,8,value);
    if (TVar1 != TIFFReadDirEntryErrOk) {
      return TVar1;
    }
  }
  else {
    *value = (uint64_t)direntry->tdir_offset;
  }
  if ((tif->tif_flags & 0x80) != 0) {
    TIFFSwabLong8(value);
  }
  return TIFFReadDirEntryErrOk;
}

Assistant:

static enum TIFFReadDirEntryErr
TIFFReadDirEntryCheckedLong8(TIFF *tif, TIFFDirEntry *direntry, uint64_t *value)
{
    if (!(tif->tif_flags & TIFF_BIGTIFF))
    {
        enum TIFFReadDirEntryErr err;
        uint32_t offset = direntry->tdir_offset.toff_long;
        if (tif->tif_flags & TIFF_SWAB)
            TIFFSwabLong(&offset);
        err = TIFFReadDirEntryData(tif, offset, 8, value);
        if (err != TIFFReadDirEntryErrOk)
            return (err);
    }
    else
        *value = direntry->tdir_offset.toff_long8;
    if (tif->tif_flags & TIFF_SWAB)
        TIFFSwabLong8(value);
    return (TIFFReadDirEntryErrOk);
}